

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O0

void __thiscall
QCborContainerPrivate::replaceAt_internal
          (QCborContainerPrivate *this,Element *e,QCborValue *value,ContainerDisposition disp)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  qint64 v;
  QCborValue *in_RDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffffb0;
  QFlagsStorage<QtCbor::Element::ValueFlag> f;
  QCborValue *in_stack_ffffffffffffffe0;
  Element *in_stack_ffffffffffffffe8;
  QCborContainerPrivate *in_stack_fffffffffffffff0;
  
  f.i = (Int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX->container == (QCborContainerPrivate *)0x0) {
    v = QCborValue::value_helper(in_RDX);
    TVar3 = QCborValue::type(in_RDX);
    memset(&stack0xffffffffffffffe4,0,4);
    QFlags<QtCbor::Element::ValueFlag>::QFlags((QFlags<QtCbor::Element::ValueFlag> *)0x1ad7f0);
    QtCbor::Element::Element
              ((Element *)CONCAT44(TVar3,in_stack_ffffffffffffffb0),v,Integer,(ValueFlags)f.i);
    *in_RSI = in_stack_ffffffffffffffe8;
    in_RSI[1] = in_stack_fffffffffffffff0;
    bVar2 = QCborValue::isContainer((QCborValue *)CONCAT44(TVar3,in_stack_ffffffffffffffb0));
    if (bVar2) {
      *in_RSI = 0;
    }
  }
  else {
    replaceAt_complex(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,
                      f.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void replaceAt_internal(QtCbor::Element &e, const QCborValue &value, ContainerDisposition disp)
    {
        if (value.container)
            return replaceAt_complex(e, value, disp);

        e = { value.value_helper(), value.type() };
        if (value.isContainer())
            e.container = nullptr;
    }